

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
spvtools::opt::Function::AddBasicBlock
          (Function *this,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *b,
          iterator ip)

{
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_20;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> local_18;
  
  local_18.iterator_ = ip.iterator_._M_current;
  local_18.container_ = ip.container_;
  ((b->_M_t).
   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
   ._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->function_ = this;
  local_20._M_head_impl =
       (b->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  (b->_M_t).
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
            (&local_18,(Uptr *)&local_20);
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&local_20);
  return;
}

Assistant:

inline void Function::AddBasicBlock(std::unique_ptr<BasicBlock> b,
                                    iterator ip) {
  b->SetParent(this);
  ip.InsertBefore(std::move(b));
}